

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adiak_internal.hpp
# Opt level: O3

adiak_datatype_t * adiak::internal::create_container_type<std::array<float,_3UL>_>::make_type(void)

{
  adiak_numerical_t aVar1;
  adiak_datatype_t *__ptr;
  adiak_datatype_t **ppaVar2;
  adiak_datatype_t *paVar3;
  
  __ptr = (adiak_datatype_t *)calloc(1,0x20);
  __ptr->dtype = adiak_list;
  aVar1 = adiak_numerical_from_type(adiak_list);
  __ptr->numerical = aVar1;
  __ptr->num_subtypes = 1;
  ppaVar2 = (adiak_datatype_t **)malloc(8);
  __ptr->subtype = ppaVar2;
  paVar3 = adiak_get_basetype(adiak_double);
  *ppaVar2 = paVar3;
  if (paVar3 == (adiak_datatype_t *)0x0) {
    free(__ptr);
    __ptr = (adiak_datatype_t *)0x0;
  }
  return __ptr;
}

Assistant:

static adiak_datatype_t *make_type() {
            adiak_datatype_t *datatype = (adiak_datatype_t *) malloc(sizeof(adiak_datatype_t));
            memset(datatype, 0, sizeof(*datatype));
            datatype->dtype = element_type<T>::dtype;
            datatype->numerical = adiak_numerical_from_type(datatype->dtype);
            datatype->num_elements = 0;
            datatype->num_subtypes = 1;
            datatype->subtype = (adiak_datatype_t **) malloc(sizeof(adiak_datatype_t *));
            datatype->subtype[0] = parse<typename T::value_type>::make_type();
            if (datatype->subtype[0] == NULL) {
               free(datatype);
               datatype = NULL;
            }
            return datatype;
         }